

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

object * newObj(int cl)

{
  object *poVar1;
  int iVar2;
  object *poVar3;
  object *poVar4;
  
  poVar3 = topScope;
  stringCopy(idName,guard->name);
  do {
    poVar4 = poVar3;
    poVar3 = poVar4->next;
    iVar2 = stringCompare(idName,poVar3->name);
    poVar1 = guard;
  } while (iVar2 != 0);
  if (poVar3 == guard) {
    poVar3 = (object *)calloc(1,0x90);
    poVar3->cl = cl;
    poVar3->next = poVar1;
    poVar4->next = poVar3;
    stringCopy(idName,poVar3->name);
    return poVar3;
  }
  mark("multiple definition");
  exit(-1);
}

Assistant:

object *newObj(int cl) {
	variable int ret;
	variable struct object *newObject; variable struct object *x;
	ret = 0; x = topScope;
	stringCopy(idName,guard->name);
	ret = stringCompare(idName,x->next->name);
	while (ret != 0) {
		x = x->next;
		ret = stringCompare(idName,x->next->name);
	}
	if (x->next == guard) {
		allocMem(newObject);
		newObject->cl = cl;	newObject->next = guard; x->next = newObject;
		stringCopy(idName,newObject->name);	
		return newObject;
	} else {
		mark("multiple definition");
		exit(-1);
	}
}